

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void TestSuite::spawnThread(ThreadInternalArgs *args)

{
  int iVar1;
  ThreadArgs *local_10;
  
  local_10 = args->userArgs;
  if ((args->func).super__Function_base._M_manager != (_Manager_type)0x0) {
    iVar1 = (*(args->func)._M_invoker)((_Any_data *)&args->func,&local_10);
    args->rc = iVar1;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

static void spawnThread(ThreadInternalArgs* args) {
        args->rc = args->func(args->userArgs);
    }